

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O1

void cfg_schema_remove_section(cfg_schema *schema,cfg_schema_section *section)

{
  list_entity *plVar1;
  list_entity *plVar2;
  ulong uVar3;
  long lVar4;
  
  if ((section->_section_node).key != (void *)0x0) {
    avl_remove(schema,section);
    (section->_section_node).key = (void *)0x0;
    if (section->entry_count != 0) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        avl_remove(&schema->entries,(long)section->entries->validate_param + lVar4 + -0x80);
        *(undefined8 *)((long)section->entries->validate_param + lVar4 + -0x58) = 0;
        uVar3 = uVar3 + 1;
        lVar4 = lVar4 + 200;
      } while (uVar3 < section->entry_count);
    }
  }
  plVar1 = (section->_delta_node).next;
  if ((plVar1 != (list_entity *)0x0) && ((section->_delta_node).prev != (list_entity *)0x0)) {
    plVar2 = (section->_delta_node).prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (section->_delta_node).next = (list_entity *)0x0;
    (section->_delta_node).prev = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
cfg_schema_remove_section(struct cfg_schema *schema, struct cfg_schema_section *section) {
  size_t i;

  if (section->_section_node.key) {
    avl_remove(&schema->sections, &section->_section_node);
    section->_section_node.key = NULL;

    for (i = 0; i < section->entry_count; i++) {
      avl_remove(&schema->entries, &section->entries[i]._node);
      section->entries[i]._node.key = NULL;
    }
  }
  if (list_is_node_added(&section->_delta_node)) {
    list_remove(&section->_delta_node);
  }
}